

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O1

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::upToLast
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *find,bool includeFind)

{
  char *__s;
  uint uVar1;
  uint uVar2;
  size_t sVar3;
  int in_ECX;
  undefined7 in_register_00000011;
  char *extraout_RDX;
  char *pcVar4;
  char *pcVar5;
  VerySimpleReadOnlyString VVar6;
  
  uVar1 = reverseFind(find,(VerySimpleReadOnlyString *)CONCAT71(in_register_00000011,includeFind),
                      0xffffffff);
  pcVar4 = find->data;
  pcVar5 = "";
  if (in_ECX == 0) {
    pcVar5 = pcVar4;
  }
  uVar2 = ((VerySimpleReadOnlyString *)CONCAT71(in_register_00000011,includeFind))->length + uVar1;
  __s = pcVar4;
  if (uVar1 == find->length) {
    uVar2 = 0;
    __s = pcVar5;
  }
  if (in_ECX == 0) {
    uVar2 = uVar1;
  }
  this->data = __s;
  if ((uVar2 == 0xffffffff) && (uVar2 = 0, __s != (char *)0x0)) {
    sVar3 = strlen(__s);
    uVar2 = (uint)sVar3;
    pcVar4 = extraout_RDX;
  }
  this->length = uVar2;
  VVar6._8_8_ = pcVar4;
  VVar6.data = (tCharPtr)this;
  return VVar6;
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::upToLast(const VerySimpleReadOnlyString & find, const bool includeFind) const
	{
	    const unsigned int pos = reverseFind(find);
	    return VerySimpleReadOnlyString(pos == (unsigned int)length && includeFind ? "" : data, includeFind ? (pos == (unsigned int)length ? 0 : pos + (unsigned int)find.length) : pos);
	}